

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall
QMdi::ControlContainer::showButtonsInMenuBar(ControlContainer *this,QMenuBar *menuBar)

{
  QObject *pQVar1;
  Data *pDVar2;
  QWidget *pQVar3;
  long lVar4;
  Data *pDVar5;
  QWidget *pQVar6;
  QWidget *pQVar7;
  
  if ((((menuBar == (QMenuBar *)0x0) || (pDVar5 = (this->mdiChild).wp.d, pDVar5 == (Data *)0x0)) ||
      (pQVar1 = (this->mdiChild).wp.value, pQVar1 == (QObject *)0x0 || *(int *)(pDVar5 + 4) == 0))
     || ((*(byte *)(*(long *)(pQVar1 + 0x20) + 0xd) & 8) != 0)) {
    return;
  }
  pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)menuBar);
  pDVar5 = (this->m_menuBar).wp.d;
  (this->m_menuBar).wp.d = pDVar2;
  (this->m_menuBar).wp.value = (QObject *)menuBar;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      operator_delete(pDVar5);
    }
  }
  pDVar5 = (this->m_menuLabel).wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (((this->m_menuLabel).wp.value != (QObject *)0x0 &&
      ((*(byte *)(*(long *)((this->mdiChild).wp.value + 0x20) + 0xd) & 0x20) != 0)))) {
    pQVar3 = QMenuBar::cornerWidget(menuBar,TopLeftCorner);
    if (pQVar3 == (QWidget *)0x0) {
      pDVar5 = (this->m_menuLabel).wp.d;
LAB_0044a64a:
      pQVar7 = (QWidget *)(this->m_menuLabel).wp.value;
      pQVar6 = (QWidget *)0x0;
      if (*(int *)(pDVar5 + 4) != 0) {
        pQVar6 = pQVar7;
      }
      if (pQVar6 != pQVar3) {
        if (*(int *)(pDVar5 + 4) == 0) {
          pQVar7 = (QWidget *)0x0;
        }
        goto LAB_0044a669;
      }
    }
    else {
      QWidget::hide(pQVar3);
      pDVar5 = (this->m_menuLabel).wp.d;
      if (pDVar5 != (Data *)0x0) goto LAB_0044a64a;
      pQVar7 = (QWidget *)0x0;
LAB_0044a669:
      QMenuBar::setCornerWidget(menuBar,pQVar7,TopLeftCorner);
      QPointer<QWidget>::operator=(&this->previousLeft,pQVar3);
      pQVar7 = (QWidget *)(this->m_menuLabel).wp.value;
    }
    QWidget::show(pQVar7);
  }
  lVar4 = QMetaObject::cast((QObject *)&ControllerWidget::staticMetaObject);
  if ((lVar4 == 0) || ((*(byte *)(lVar4 + 0x30) & 7) == 0)) goto LAB_0044a73a;
  pQVar3 = QMenuBar::cornerWidget(menuBar,TopRightCorner);
  if (pQVar3 == (QWidget *)0x0) {
    pDVar5 = (this->m_controllerWidget).wp.d;
LAB_0044a6ef:
    pQVar7 = (QWidget *)(this->m_controllerWidget).wp.value;
    pQVar6 = (QWidget *)0x0;
    if (*(int *)(pDVar5 + 4) != 0) {
      pQVar6 = pQVar7;
    }
    if (pQVar6 != pQVar3) {
      if (*(int *)(pDVar5 + 4) == 0) {
        pQVar7 = (QWidget *)0x0;
      }
      goto LAB_0044a70e;
    }
  }
  else {
    QWidget::hide(pQVar3);
    pDVar5 = (this->m_controllerWidget).wp.d;
    if (pDVar5 != (Data *)0x0) goto LAB_0044a6ef;
    pQVar7 = (QWidget *)0x0;
LAB_0044a70e:
    QMenuBar::setCornerWidget(menuBar,pQVar7,TopRightCorner);
    QPointer<QWidget>::operator=(&this->previousRight,pQVar3);
    pQVar7 = (QWidget *)(this->m_controllerWidget).wp.value;
  }
  QWidget::show(pQVar7);
LAB_0044a73a:
  QMdiSubWindowPrivate::setNewWindowTitle(*(QMdiSubWindowPrivate **)((this->mdiChild).wp.value + 8))
  ;
  return;
}

Assistant:

void ControlContainer::showButtonsInMenuBar(QMenuBar *menuBar)
{
    if (!menuBar || !mdiChild || mdiChild->windowFlags() & Qt::FramelessWindowHint)
        return;
    m_menuBar = menuBar;

    if (m_menuLabel && mdiChild->windowFlags() & Qt::WindowSystemMenuHint) {
        QWidget *currentLeft = menuBar->cornerWidget(Qt::TopLeftCorner);
        if (currentLeft)
            currentLeft->hide();
        if (currentLeft != m_menuLabel) {
            menuBar->setCornerWidget(m_menuLabel, Qt::TopLeftCorner);
            previousLeft = currentLeft;
        }
        m_menuLabel->show();
    }
    ControllerWidget *controllerWidget = qobject_cast<ControllerWidget *>(m_controllerWidget);
    if (controllerWidget && controllerWidget->hasVisibleControls()) {
        QWidget *currentRight = menuBar->cornerWidget(Qt::TopRightCorner);
        if (currentRight)
            currentRight->hide();
        if (currentRight != m_controllerWidget) {
            menuBar->setCornerWidget(m_controllerWidget, Qt::TopRightCorner);
            previousRight = currentRight;
        }
        m_controllerWidget->show();
    }
    mdiChild->d_func()->setNewWindowTitle();
}